

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_capability.cpp
# Opt level: O3

bool spvtools::val::anon_unknown_2::IsEnabledByExtension(ValidationState_t *_,uint32_t capability)

{
  bool bVar1;
  ulong uVar2;
  Extension *value;
  ExtensionSet operand_exts;
  spv_operand_desc operand_desc;
  EnumSet<spvtools::Extension> local_78;
  spv_operand_desc local_50;
  pair<spvtools::EnumSet<spvtools::Extension>::Iterator,_bool> local_48;
  
  local_50 = (spv_operand_desc)0x0;
  AssemblyGrammar::lookupOperand(&_->grammar_,SPV_OPERAND_TYPE_CAPABILITY,capability,&local_50);
  if (local_50 == (spv_operand_desc)0x0) {
    __assert_fail("operand_desc",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_capability.cpp"
                  ,0xef,
                  "bool spvtools::val::(anonymous namespace)::IsEnabledByExtension(ValidationState_t &, uint32_t)"
                 );
  }
  uVar2 = (ulong)local_50->numExtensions;
  value = local_50->extensions;
  local_78.buckets_.
  super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.size_ = 0;
  local_78.buckets_.
  super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.buckets_.
  super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (uVar2 == 0) {
    bVar1 = false;
  }
  else {
    do {
      EnumSet<spvtools::Extension>::insert(&local_48,&local_78,value);
      value = value + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
    if (local_78.size_ == 0) {
      bVar1 = false;
    }
    else {
      bVar1 = ValidationState_t::HasAnyOfExtensions(_,&local_78);
    }
  }
  if (local_78.buckets_.
      super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.buckets_.
                    super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.buckets_.
                          super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.buckets_.
                          super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool IsEnabledByExtension(ValidationState_t& _, uint32_t capability) {
  spv_operand_desc operand_desc = nullptr;
  _.grammar().lookupOperand(SPV_OPERAND_TYPE_CAPABILITY, capability,
                            &operand_desc);

  // operand_desc is expected to be not null, otherwise validator would have
  // failed at an earlier stage. This 'assert' is 'just in case'.
  assert(operand_desc);

  ExtensionSet operand_exts(operand_desc->numExtensions,
                            operand_desc->extensions);
  if (operand_exts.empty()) return false;

  return _.HasAnyOfExtensions(operand_exts);
}